

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O2

void __thiscall arguments_t::arguments_t(arguments_t *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  mapped_type *pmVar3;
  int iVar4;
  char **ppcVar5;
  char **ppcVar6;
  string value;
  string key;
  allocator local_99;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  p_Var1 = &(this->options)._M_t._M_impl.super__Rb_tree_header;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_98 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->parameters;
  iVar4 = argc + -1;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->parameters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppcVar5 = argv + 1;
  while (0 < iVar4) {
    pcVar2 = *ppcVar5;
    if (*pcVar2 == '-') {
      std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&local_90);
      local_90 = local_80;
      local_88 = 0;
      ppcVar6 = ppcVar5 + 1;
      local_80[0] = 0;
      if (iVar4 == 1) {
        iVar4 = 0;
      }
      else {
        std::__cxx11::string::string(local_50,*ppcVar6,&local_99);
        std::__cxx11::string::operator=((string *)&local_90,local_50);
        std::__cxx11::string::~string(local_50);
        iVar4 = iVar4 + -2;
        ppcVar6 = ppcVar5 + 2;
      }
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->options,&local_70);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      ppcVar5 = ppcVar6;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&local_90);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_98,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      iVar4 = iVar4 + -1;
      ppcVar5 = ppcVar5 + 1;
    }
  }
  return;
}

Assistant:

arguments_t::arguments_t(int argc, char** argv) {
    argc--;
    argv++;
    while (argc > 0) {
        if (*argv[0] == '-') {
            std::string key(*argv);
            argc--;
            argv++;
            std::string value;
            if (argc > 0) {
                value = std::string(*argv);
                argc--;
                argv++;
            }
            this->options[key] = value;
        }
        else {
            this->parameters.push_back(*argv);
            argc--;
            argv++;
        }
    }
}